

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB_IPIStream.cpp
# Opt level: O1

ErrorCode PDB::HasValidIPIStream(RawFile *file)

{
  ErrorCode EVar1;
  DirectMSFStream stream;
  StreamHeader header;
  DirectMSFStream DStack_68;
  int local_48 [14];
  
  RawFile::CreateMSFStream<PDB::DirectMSFStream>(&DStack_68,file,4);
  EVar1 = InvalidStream;
  if (0x37 < DStack_68.m_size) {
    DirectMSFStream::ReadAtOffset(&DStack_68,local_48,0x38,0);
    EVar1 = UnknownVersion;
    if (local_48[0] == 0x131ca0b) {
      EVar1 = Success;
    }
  }
  return EVar1;
}

Assistant:

PDB_NO_DISCARD PDB::ErrorCode PDB::HasValidIPIStream(const RawFile& file) PDB_NO_EXCEPT
{
	DirectMSFStream stream = file.CreateMSFStream<DirectMSFStream>(IPIStreamIndex);
	if (stream.GetSize() < sizeof(IPI::StreamHeader))
	{
		return ErrorCode::InvalidStream;
	}

	const IPI::StreamHeader header = stream.ReadAtOffset<IPI::StreamHeader>(0u);
	if (header.version != IPI::StreamHeader::Version::V80)
	{
		return ErrorCode::UnknownVersion;
	}

	return ErrorCode::Success;
}